

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_computer.h
# Opt level: O1

void __thiscall
directed_flag_complex_computer::compute_filtration_t::operator()
          (compute_filtration_t *this,vertex_index_t *first_vertex,int size)

{
  pointer phVar1;
  iterator __position;
  int iVar2;
  value_t *pvVar3;
  iterator iVar4;
  pointer pfVar5;
  _func_int **pp_Var6;
  runtime_error *this_00;
  filtered_directed_graph_t *pfVar7;
  short sVar8;
  unsigned_short dim;
  filtration_algorithm_t *pfVar9;
  ulong uVar10;
  float extraout_XMM0_Da;
  directed_flag_complex_cell_t cell;
  string err;
  directed_flag_complex_boundary_cell_t bdry;
  string local_b0;
  directed_flag_complex_cell_t local_90;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  key_type local_60;
  ulong local_50;
  directed_flag_complex_cell_t local_48;
  ulong local_38;
  
  this->current_index = this->current_index + 1;
  local_90._vptr_directed_flag_complex_cell_t = (_func_int **)&PTR_vertex_0014f288;
  dim = (unsigned_short)(size - 2U);
  if (size - 2U != (uint)cell_hasher_t::dimension) {
    cell_hasher_t::dimension = dim;
  }
  if (this->filtration_algorithm != (filtration_algorithm_t *)0x0) {
    local_90.vertices = first_vertex;
    iVar2 = (*this->filtration_algorithm->_vptr_filtration_algorithm_t[5])();
    if ((char)iVar2 == '\0') {
      pfVar7 = this->graph;
      pfVar9 = this->filtration_algorithm;
      pp_Var6 = pfVar9->_vptr_filtration_algorithm_t;
      pvVar3 = (value_t *)0x0;
    }
    else {
      if (this->boundary_filtration == (value_t *)0x0) {
        uVar10 = 0xffffffffffffffff;
        if (-1 < size) {
          uVar10 = (long)size << 2;
        }
        pvVar3 = (value_t *)operator_new__(uVar10);
        this->boundary_filtration = pvVar3;
      }
      if (0 < size) {
        uVar10 = 0;
        do {
          local_60.vertices = local_90.vertices;
          local_60._vptr_directed_flag_complex_cell_t = (_func_int **)&PTR_vertex_0014f2a0;
          phVar1 = (this->cell_hash->
                   super__Vector_base<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_50 = uVar10;
          if ((this->cell_hash->
              super__Vector_base<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>,_std::allocator<hash_map<directed_flag_complex_cell_t,_unsigned_long,_cell_hasher_t,_cell_comparer_t>_>_>
              )._M_impl.super__Vector_impl_data._M_finish == phVar1) {
            pfVar5 = (this->current_filtration->super__Vector_base<float,_std::allocator<float>_>).
                     _M_impl.super__Vector_impl_data._M_start + local_90.vertices[uVar10 == 0];
          }
          else {
            sVar8 = (short)((ulong)local_90.vertices[uVar10 == 0] % this->nb_threads);
            iVar4 = std::
                    _Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find((_Hashtable<directed_flag_complex_cell_t,_std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_std::allocator<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>_>,_std::__detail::_Select1st,_cell_comparer_t,_cell_hasher_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)(phVar1 + sVar8),&local_60);
            if (iVar4.
                super__Node_iterator_base<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_true>
                ._M_cur == (__node_type *)0x0) {
              local_80[0] = local_70;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_80,"Could not find boundary ","");
              local_48.vertices = local_90.vertices;
              local_48._vptr_directed_flag_complex_cell_t = (_func_int **)&PTR_vertex_0014f2a0;
              local_38 = uVar10;
              directed_flag_complex_cell_t::to_string_abi_cxx11_(&local_b0,&local_48,dim);
              std::__cxx11::string::_M_append((char *)local_80,(ulong)local_b0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1
                               );
              }
              std::__cxx11::string::append((char *)local_80);
              directed_flag_complex_cell_t::to_string_abi_cxx11_
                        (&local_b0,&local_90,(short)size - 1);
              std::__cxx11::string::_M_append((char *)local_80,(ulong)local_b0._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1
                               );
              }
              std::__cxx11::string::append((char *)local_80);
              this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this_00,(string *)local_80);
              __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            pfVar5 = (this->current_filtration->super__Vector_base<float,_std::allocator<float>_>).
                     _M_impl.super__Vector_impl_data._M_start +
                     *(long *)((long)iVar4.
                                     super__Node_iterator_base<std::pair<const_directed_flag_complex_cell_t,_unsigned_long>,_true>
                                     ._M_cur + 0x18) + this->cell_hash_offsets[sVar8];
          }
          this->boundary_filtration[uVar10] = *pfVar5;
          uVar10 = uVar10 + 1;
        } while ((uint)size != uVar10);
      }
      pfVar9 = this->filtration_algorithm;
      pfVar7 = this->graph;
      pvVar3 = this->boundary_filtration;
      pp_Var6 = pfVar9->_vptr_filtration_algorithm_t;
    }
    (*pp_Var6[2])(pfVar9,(ulong)(size - 1U & 0xffff),&local_90,pfVar7,pvVar3);
    local_80[0] = (undefined1 *)CONCAT44(local_80[0]._4_4_,extraout_XMM0_Da);
    __position._M_current =
         (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&this->next_filtration,__position,(float *)local_80);
    }
    else {
      *__position._M_current = extraout_XMM0_Da;
      (this->next_filtration).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return;
}

Assistant:

void operator()(vertex_index_t* first_vertex, int size) {
		// The index starts at -1, so the first cell gets index 0
		current_index++;
		directed_flag_complex_cell_t cell(first_vertex);
		if (cell_hasher_t::dimension != size - 2) cell_hasher_t::set_current_cell_dimension(size - 2);

		if (filtration_algorithm == nullptr) return;

		if (filtration_algorithm->needs_face_filtration()) {
			if (boundary_filtration == nullptr) boundary_filtration = new value_t[size];

			for (int i = 0; i < size; i++) {
				auto bdry = cell.boundary(i);

				if (!cell_hash.size()) {
					// In the case where no cell hash is given, we are looking
					// at edges
					assert(size == 2);
					boundary_filtration[i] = current_filtration[bdry.vertex(0)];
				} else {
					// The threads are split by the first vertex
					const short thread_index = bdry.vertex(0) % nb_threads;
					auto pair = cell_hash[thread_index].find(bdry);

					if (pair == cell_hash[thread_index].end()) {
						std::string err = "Could not find boundary ";
						err += cell.boundary(i).to_string(size - 2);
						err += " of ";
						err += cell.to_string(size - 1);
						err += ".\n";
						throw std::runtime_error(err);
					}
					boundary_filtration[i] = current_filtration[pair->second + cell_hash_offsets[thread_index]];
				}
			}

			next_filtration.push_back(
			    filtration_algorithm->compute_filtration(size - 1, cell, graph, boundary_filtration));
		} else {
			next_filtration.push_back(filtration_algorithm->compute_filtration(size - 1, cell, graph, nullptr));
		}
	}